

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_cycle_3.h
# Opt level: O2

void __thiscall PlayerCycle_3::~PlayerCycle_3(PlayerCycle_3 *this)

{
  Player::~Player(&this->super_Player);
  operator_delete(this);
  return;
}

Assistant:

PlayerCycle_3(const std::string& name) :
      Player(name),
      m_play(rand()%3)
   {}